

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O0

int stbtt_BakeFontBitmap
              (uchar *data,int offset,float pixel_height,uchar *pixels,int pw,int ph,int first_char,
              int num_chars,stbtt_bakedchar *chardata)

{
  int iVar1;
  int out_w;
  int out_h;
  float scale_x;
  int g;
  int gh;
  int gw;
  int y1;
  int x1;
  int y0;
  int x0;
  int lsb;
  int advance;
  stbtt_fontinfo f;
  int i;
  int bottom_y;
  int y;
  int x;
  float scale;
  int first_char_local;
  int ph_local;
  int pw_local;
  uchar *pixels_local;
  float pixel_height_local;
  int offset_local;
  uchar *data_local;
  
  _lsb = (void *)0x0;
  iVar1 = stbtt_InitFont((stbtt_fontinfo *)&lsb,data,offset);
  if (iVar1 == 0) {
    data_local._4_4_ = -1;
  }
  else {
    memset(pixels,0,(long)(pw * ph));
    i = 1;
    bottom_y = 1;
    f.indexToLocFormat = 1;
    scale_x = stbtt_ScaleForPixelHeight((stbtt_fontinfo *)&lsb,pixel_height);
    for (f.index_map = 0; f.index_map < num_chars; f.index_map = f.index_map + 1) {
      iVar1 = stbtt_FindGlyphIndex((stbtt_fontinfo *)&lsb,first_char + f.index_map);
      stbtt_GetGlyphHMetrics((stbtt_fontinfo *)&lsb,iVar1,&x0,&y0);
      stbtt_GetGlyphBitmapBox((stbtt_fontinfo *)&lsb,iVar1,scale_x,scale_x,&x1,&y1,&gw,&gh);
      out_w = gw - x1;
      out_h = gh - y1;
      if (pw <= bottom_y + out_w + 1) {
        i = f.indexToLocFormat;
        bottom_y = 1;
      }
      if (ph <= i + out_h + 1) {
        return -f.index_map;
      }
      if (pw <= bottom_y + out_w) {
        __assert_fail("x+gw < pw",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                      ,0xa04,
                      "int stbtt_BakeFontBitmap(const unsigned char *, int, float, unsigned char *, int, int, int, int, stbtt_bakedchar *)"
                     );
      }
      if (ph <= i + out_h) {
        __assert_fail("y+gh < ph",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/3rdparty/stb_truetype.h"
                      ,0xa05,
                      "int stbtt_BakeFontBitmap(const unsigned char *, int, float, unsigned char *, int, int, int, int, stbtt_bakedchar *)"
                     );
      }
      stbtt_MakeGlyphBitmap
                ((stbtt_fontinfo *)&lsb,pixels + (long)(i * pw) + (long)bottom_y,out_w,out_h,pw,
                 scale_x,scale_x,iVar1);
      chardata[f.index_map].x0 = (unsigned_short)bottom_y;
      chardata[f.index_map].y0 = (unsigned_short)i;
      chardata[f.index_map].x1 = (unsigned_short)bottom_y + (short)out_w;
      chardata[f.index_map].y1 = (unsigned_short)i + (short)out_h;
      chardata[f.index_map].xadvance = scale_x * (float)x0;
      chardata[f.index_map].xoff = (float)x1;
      chardata[f.index_map].yoff = (float)y1;
      bottom_y = bottom_y + out_w + 1;
      if (f.indexToLocFormat < i + out_h + 1) {
        f.indexToLocFormat = i + out_h + 1;
      }
    }
    data_local._4_4_ = f.indexToLocFormat;
  }
  return data_local._4_4_;
}

Assistant:

STBTT_DEF int stbtt_BakeFontBitmap(const unsigned char *data, int offset,  // font location (use offset=0 for plain .ttf)
                                float pixel_height,                     // height of font in pixels
                                unsigned char *pixels, int pw, int ph,  // bitmap to be filled in
                                int first_char, int num_chars,          // characters to bake
                                stbtt_bakedchar *chardata)
{
   float scale;
   int x,y,bottom_y, i;
   stbtt_fontinfo f;
   f.userdata = NULL;
   if (!stbtt_InitFont(&f, data, offset))
      return -1;
   STBTT_memset(pixels, 0, pw*ph); // background of 0 around pixels
   x=y=1;
   bottom_y = 1;

   scale = stbtt_ScaleForPixelHeight(&f, pixel_height);

   for (i=0; i < num_chars; ++i) {
      int advance, lsb, x0,y0,x1,y1,gw,gh;
      int g = stbtt_FindGlyphIndex(&f, first_char + i);
      stbtt_GetGlyphHMetrics(&f, g, &advance, &lsb);
      stbtt_GetGlyphBitmapBox(&f, g, scale,scale, &x0,&y0,&x1,&y1);
      gw = x1-x0;
      gh = y1-y0;
      if (x + gw + 1 >= pw)
         y = bottom_y, x = 1; // advance to next row
      if (y + gh + 1 >= ph) // check if it fits vertically AFTER potentially moving to next row
         return -i;
      STBTT_assert(x+gw < pw);
      STBTT_assert(y+gh < ph);
      stbtt_MakeGlyphBitmap(&f, pixels+x+y*pw, gw,gh,pw, scale,scale, g);
      chardata[i].x0 = (stbtt_int16) x;
      chardata[i].y0 = (stbtt_int16) y;
      chardata[i].x1 = (stbtt_int16) (x + gw);
      chardata[i].y1 = (stbtt_int16) (y + gh);
      chardata[i].xadvance = scale * advance;
      chardata[i].xoff     = (float) x0;
      chardata[i].yoff     = (float) y0;
      x = x + gw + 1;
      if (y+gh+1 > bottom_y)
         bottom_y = y+gh+1;
   }
   return bottom_y;
}